

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O1

void cvui::internal::rect
               (cvui_block_t *theBlock,int theX,int theY,int theWidth,int theHeight,
               uint theBorderColor,uint theFillingColor)

{
  int iVar1;
  int iVar2;
  Rect aRect;
  Size local_30;
  Rect local_28;
  
  local_28.x = (theWidth >> 0x1f & theWidth) + theX;
  local_28.y = (theHeight >> 0x1f & theHeight) + theY;
  iVar1 = -theWidth;
  if (0 < theWidth) {
    iVar1 = theWidth;
  }
  iVar2 = -theHeight;
  if (0 < theHeight) {
    iVar2 = theHeight;
  }
  local_28.width = iVar1;
  local_28.height = iVar2;
  render::rect(theBlock,&local_28,theBorderColor,theFillingColor);
  local_30.width = iVar1;
  local_30.height = iVar2;
  updateLayoutFlow(theBlock,&local_30);
  return;
}

Assistant:

void rect(cvui_block_t& theBlock, int theX, int theY, int theWidth, int theHeight, unsigned int theBorderColor, unsigned int theFillingColor) {
		cv::Point aAnchor(theX, theY);
		cv::Rect aRect(theX, theY, theWidth, theHeight);

		aRect.x = aRect.width < 0 ? aAnchor.x + aRect.width : aAnchor.x;
		aRect.y = aRect.height < 0 ? aAnchor.y + aRect.height : aAnchor.y;
		aRect.width = std::abs(aRect.width);
		aRect.height = std::abs(aRect.height);

		render::rect(theBlock, aRect, theBorderColor, theFillingColor);

		// Update the layout flow
		cv::Size aSize(aRect.width, aRect.height);
		updateLayoutFlow(theBlock, aSize);
	}